

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

void tty_setbaudrate(void)

{
  speed_t __speed;
  uint uVar1;
  termios options;
  termios local_4c;
  
  if (-1 < TTY_Fd) {
    uVar1 = *(ushort *)DLTTYOut >> 4 & 0xf;
    if ((uVar1 == 0xf) || ((0x55ffU >> uVar1 & 1) == 0)) {
      error("TTY: tty_setbaudrate");
      return;
    }
    __speed = *(speed_t *)(&DAT_00147d60 + (ulong)uVar1 * 4);
    tcgetattr(TTY_Fd,&local_4c);
    cfsetispeed(&local_4c,__speed);
    cfsetospeed(&local_4c,__speed);
    tcsetattr(TTY_Fd,0,&local_4c);
  }
  return;
}

Assistant:

void tty_setbaudrate(void)
{
  speed_t baudrate;

  if (TTY_Fd >= 0) {
    if ((baudrate = tty_baudtosymbol(DLTTYOut->line_speed)) != -1) {
        struct termios options;
        tcgetattr(TTY_Fd, &options);
        cfsetispeed(&options, baudrate);
        cfsetospeed(&options, baudrate);
        tcsetattr(TTY_Fd, TCSANOW, &options);
    } else {
      error("TTY: tty_setbaudrate");
    }
  }
}